

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# show.hpp
# Opt level: O3

string * __thiscall
lambda::show<std::__cxx11::string>
          (string *__return_storage_ptr__,lambda *this,
          Maybe<std::__cxx11::basic_string<char>_> *maybe)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  long *local_60;
  undefined8 local_58;
  long local_50;
  undefined8 uStack_48;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  if (this[0x20] == (lambda)0x1) {
    local_80 = (long *)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,*(long *)this,*(long *)(this + 8) + *(long *)this);
    if (local_80 == (long *)&local_70) {
      uStack_48 = uStack_68;
      local_60 = &local_50;
    }
    else {
      local_60 = local_80;
    }
    local_50 = CONCAT71(uStack_6f,local_70);
    local_58 = local_78;
    local_78 = 0;
    local_70 = 0;
    local_80 = (long *)&local_70;
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x15c99e);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_30 = *plVar3;
      lStack_28 = plVar2[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar3;
      local_40 = (long *)*plVar2;
    }
    local_38 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_40 != &local_30) {
      operator_delete(local_40,local_30 + 1);
    }
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if (local_80 != (long *)&local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"None","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string show(const Maybe<T> maybe) {
    return maybe ? "Some(" + show(*maybe) + ")" : "None";
}